

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O0

uv_loop_t * uv_default_loop(void)

{
  int iVar1;
  int unaff_retaddr;
  uv_loop_t *in_stack_00000008;
  uv_loop_t *local_8;
  
  if (default_loop_ptr == (uv_loop_t *)0x0) {
    iVar1 = uv__loop_init(in_stack_00000008,unaff_retaddr);
    if (iVar1 == 0) {
      default_loop_ptr = &default_loop_struct;
      local_8 = &default_loop_struct;
    }
    else {
      local_8 = (uv_loop_t *)0x0;
    }
  }
  else {
    local_8 = default_loop_ptr;
  }
  return local_8;
}

Assistant:

uv_loop_t* uv_default_loop(void) {
  if (default_loop_ptr != NULL)
    return default_loop_ptr;

  if (uv__loop_init(&default_loop_struct, /* default_loop? */ 1))
    return NULL;

  default_loop_ptr = &default_loop_struct;
  return default_loop_ptr;
}